

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O0

deBool vk::BinaryRegistryDetail::anon_unknown_8::binaryEqual(ProgramBinary *a,ProgramBinary *b)

{
  size_t sVar1;
  size_t sVar2;
  deUint8 *ptr;
  deUint8 *cmp;
  ProgramBinary *b_local;
  ProgramBinary *a_local;
  
  sVar1 = ProgramBinary::getSize(a);
  sVar2 = ProgramBinary::getSize(b);
  if (sVar1 == sVar2) {
    ptr = ProgramBinary::getBinary(a);
    cmp = ProgramBinary::getBinary(b);
    sVar1 = ProgramBinary::getSize(a);
    a_local._4_4_ = deMemoryEqual(ptr,cmp,sVar1);
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

deBool binaryEqual (const ProgramBinary* a, const ProgramBinary* b)
{
	if (a->getSize() == b->getSize())
		return deMemoryEqual(a->getBinary(), b->getBinary(), a->getSize());
	else
		return DE_FALSE;
}